

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O1

BaseState<true> * __thiscall
DefaultState<true>::Float(DefaultState<true> *this,Context<true> *ctx,float f)

{
  pointer pNVar1;
  vw *pvVar2;
  uint64_t uVar3;
  substring sVar4;
  allocator local_4d;
  float local_4c;
  char *local_48;
  long local_40;
  char local_38 [16];
  
  pNVar1 = (ctx->namespace_path).
           super__Vector_base<Namespace<true>,_std::allocator<Namespace<true>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pvVar2 = ctx->all;
  local_4c = f;
  std::__cxx11::string::string((string *)&local_48,ctx->key,&local_4d);
  sVar4.end = local_48 + local_40;
  sVar4.begin = local_48;
  uVar3 = (*pvVar2->p->hasher)(sVar4,pNVar1[-1].namespace_hash);
  Namespace<true>::AddFeature(pNVar1 + -1,local_4c,uVar3 & pvVar2->parse_mask,ctx->key);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return &this->super_BaseState<true>;
}

Assistant:

BaseState<audit>* Float(Context<audit>& ctx, float f)
  {
    auto& ns = ctx.CurrentNamespace();
    ns.AddFeature(f, VW::hash_feature(*ctx.all, ctx.key, ns.namespace_hash), ctx.key);

    return this;
  }